

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *local_88;
  char *local_80;
  char *local_78;
  char *marker;
  int line_local;
  char *file_local;
  GTestLogSeverity severity_local;
  GTestLog *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->severity_ = severity;
  if (severity == GTEST_INFO) {
    local_78 = "[  INFO ]";
  }
  else {
    if (severity == GTEST_WARNING) {
      local_80 = "[WARNING]";
    }
    else {
      if (severity == GTEST_ERROR) {
        local_88 = "[ ERROR ]";
      }
      else {
        local_88 = "[ FATAL ]";
      }
      local_80 = local_88;
    }
    local_78 = local_80;
  }
  poVar1 = GetStream(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,local_78);
  poVar1 = std::operator<<(poVar1," ");
  FormatFileLocation_abi_cxx11_
            ((string *)&this_local,(internal *)file,(char *)(ulong)(uint)line,severity);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker =
      severity == GTEST_INFO ?    "[  INFO ]" :
      severity == GTEST_WARNING ? "[WARNING]" :
      severity == GTEST_ERROR ?   "[ ERROR ]" : "[ FATAL ]";
  GetStream() << ::std::endl << marker << " "
              << FormatFileLocation(file, line).c_str() << ": ";
}